

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O1

void ssh1_bpp_handle_output(BinaryPacketProtocol *bpp)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  LogContext *ctx;
  long *plVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint32_t uVar9;
  PktOut *pkt;
  undefined4 extraout_var;
  char *texttype;
  size_t len;
  ptrlen pkt_00;
  ptrlen data;
  int local_7c;
  PacketQueueBase *local_78;
  undefined8 local_70;
  logblank_t blanks [4];
  
  if (*(char *)&bpp[-1].ic_out_pq.ctx == '\0') {
    local_78 = &(bpp->out_pq).pqb;
    do {
      pkt = (*(bpp->out_pq).after)(local_78,&local_78->end,true);
      if (pkt == (PktOut *)0x0) goto LAB_0011ca71;
      iVar2 = pkt->type;
      if (bpp->logctx != (LogContext *)0x0) {
        sVar3 = pkt->prefix;
        puVar4 = pkt->data;
        len = pkt->length - sVar3;
        pkt_00.len = len;
        pkt_00.ptr = puVar4 + sVar3;
        iVar6 = ssh1_censor_packet(bpp->pls,pkt->type,true,pkt_00,blanks);
        local_70 = CONCAT44(extraout_var,iVar6);
        ctx = bpp->logctx;
        iVar6 = pkt->type;
        texttype = ssh1_pkt_type(iVar6);
        log_packet(ctx,1,iVar6,texttype,puVar4 + sVar3,len,(int)local_70,blanks,(unsigned_long *)0x0
                   ,0,(char *)0x0);
      }
      plVar5 = *(long **)&bpp[-1].ic_out_pq.queued;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x20))
                  (plVar5,pkt->data + 0xc,(int)pkt->length + -0xc,blanks,&local_7c,0);
        pkt->length = 0xc;
        BinarySink_put_data(pkt->binarysink_,(void *)blanks[0]._0_8_,(long)local_7c);
        safefree((void *)blanks[0]._0_8_);
      }
      BinarySink_put_uint32(pkt->binarysink_,0);
      iVar6 = (int)pkt->length;
      uVar1 = iVar6 - 0xc;
      uVar7 = iVar6 - 5;
      if (-1 < (int)uVar1) {
        uVar7 = uVar1;
      }
      iVar8 = (iVar6 - (uVar7 & 0xfffffff8)) + -0xc;
      iVar6 = iVar6 - iVar8;
      random_read(pkt->data + iVar8,(ulong)(0xc - iVar8));
      data.ptr = pkt->data + (long)iVar8 + 4;
      data.len = (size_t)(iVar6 + -8);
      uVar9 = crc32_ssh1(data);
      *(uint32_t *)(pkt->data + (long)(iVar6 + -4) + (long)iVar8) =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      *(uint *)(pkt->data + iVar8) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 * 0x1000000;
      plVar5 = (long *)bpp[-1].ic_in_raw.ctx;
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x20))(plVar5,pkt->data + (long)iVar8 + 4,iVar6 + -4);
      }
      bufchain_add(bpp->out_raw,pkt->data + iVar8,(long)iVar6);
      ssh_free_pktout(pkt);
    } while (iVar2 != 0x25);
    *(undefined1 *)&bpp[-1].ic_out_pq.ctx = 1;
LAB_0011ca71:
    ssh_sendbuffer_changed(bpp->ssh);
  }
  return;
}

Assistant:

static void ssh1_bpp_handle_output(BinaryPacketProtocol *bpp)
{
    struct ssh1_bpp_state *s = container_of(bpp, struct ssh1_bpp_state, bpp);
    PktOut *pkt;

    if (s->pending_compression_request) {
        /*
         * Don't send any output packets while we're awaiting a
         * response to SSH1_CMSG_REQUEST_COMPRESSION, because if they
         * cross over in transit with the responding SSH1_CMSG_SUCCESS
         * then the other end could decode them with the wrong
         * compression settings.
         */
        return;
    }

    while ((pkt = pq_pop(&s->bpp.out_pq)) != NULL) {
        int type = pkt->type;
        ssh1_bpp_format_packet(s, pkt);
        ssh_free_pktout(pkt);

        if (type == SSH1_CMSG_REQUEST_COMPRESSION) {
            /*
             * When we see the actual compression request go past, set
             * the pending flag, and stop processing packets this
             * time.
             */
            s->pending_compression_request = true;
            break;
        }
    }

    ssh_sendbuffer_changed(bpp->ssh);
}